

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

bool jsoncons::
     sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
     ::compare(index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *item1,index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *item2)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::wstring::compare((wstring *)item1);
  if (iVar2 < 0) {
    bVar1 = true;
  }
  else if (iVar2 == 0) {
    bVar1 = item1->index < item2->index;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool compare(const index_key_value<Json>& item1, const index_key_value<Json>& item2)
        {
            int comp = item1.name.compare(item2.name); 
            if (comp < 0) return true;
            if (comp == 0) return item1.index < item2.index;

            return false;
        }